

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_a31d20::MemPoolAccept::SubmitPackage
          (MemPoolAccept *this,ATMPArgs *args,
          vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          *workspaces,PackageValidationState *package_state,
          map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
          *results)

{
  initializer_list<transaction_identifier<true>_> __l;
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  byte bVar2;
  const_iterator args_3;
  const_iterator args_2;
  back_insert_iterator<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
  args_1;
  reference pWVar3;
  Wtxid *pWVar4;
  _Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> mempool_sequence;
  CTxMemPoolEntry *in_RCX;
  long in_RSI;
  long *in_RDI;
  NewMempoolTransactionInfo *in_R8;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_>,_bool> pVar5;
  CTransaction *tx;
  Workspace *ws_1;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *__range1_1;
  Workspace *ws;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *__range1;
  bool all_submitted;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  effective_feerate_wtxids;
  CFeeRate effective_feerate;
  iterator __end1_1;
  iterator __begin1_1;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids;
  iterator __end1;
  iterator __begin1;
  NewMempoolTransactionInfo tx_info;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  ancestors;
  uint in_stack_fffffffffffff688;
  int in_stack_fffffffffffff68c;
  char *in_stack_fffffffffffff690;
  undefined4 uVar6;
  Chainstate *in_stack_fffffffffffff698;
  undefined4 uVar7;
  Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
  *in_stack_fffffffffffff6a0;
  anon_class_8_1_8991fb9c in_stack_fffffffffffff6a8;
  __normal_iterator<const_(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
  in_stack_fffffffffffff6b0;
  __normal_iterator<const_(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
  in_stack_fffffffffffff6b8;
  undefined7 in_stack_fffffffffffff6c0;
  undefined1 in_stack_fffffffffffff6c7;
  allocator<char> *in_stack_fffffffffffff6c8;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6d8;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  *in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f4;
  undefined1 in_stack_fffffffffffff6f5;
  byte bVar8;
  undefined1 in_stack_fffffffffffff6f6;
  undefined1 in_stack_fffffffffffff6f7;
  undefined8 in_stack_fffffffffffff6f8;
  int source_line;
  NewMempoolTransactionInfo *tx_00;
  Workspace *in_stack_fffffffffffff730;
  ATMPArgs *in_stack_fffffffffffff738;
  ConstevalFormatString<4U> fmt;
  MemPoolAccept *in_stack_fffffffffffff740;
  CTxMemPoolEntry *in_stack_fffffffffffff748;
  CTxMemPool *in_stack_fffffffffffff750;
  undefined7 in_stack_fffffffffffff758;
  undefined1 in_stack_fffffffffffff75f;
  Workspace *in_stack_fffffffffffff7c8;
  undefined7 in_stack_fffffffffffff7d0;
  undefined1 in_stack_fffffffffffff7d7;
  _Rb_tree_iterator<std::pair<const_uint256,_MempoolAcceptResult>_> in_stack_fffffffffffff7d8;
  unsigned_long *in_stack_fffffffffffff840;
  byte local_779;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [8];
  undefined1 local_6e0 [66];
  undefined1 local_69e [4];
  allocator<char> local_69a [74];
  bool local_650;
  _Base_ptr local_648;
  undefined1 local_640;
  _Base_ptr local_638;
  undefined1 local_630;
  _Base_ptr local_628;
  undefined1 local_620;
  _Base_ptr local_538;
  _Base_ptr p_Stack_530;
  _Base_ptr local_528;
  size_t sStack_520;
  CTxMemPool local_4f8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
             (AnnotatedMixin<std::recursive_mutex> *)0x8010ef);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffff698,in_stack_fffffffffffff690,in_stack_fffffffffffff68c,
             (AnnotatedMixin<std::recursive_mutex> *)0x801116);
  std::
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  ::cbegin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            *)in_stack_fffffffffffff690);
  std::
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  ::cend((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          *)in_stack_fffffffffffff690);
  bVar1 = std::
          all_of<__gnu_cxx::__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_const*,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>>,(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__0>
                    (in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
  if (!bVar1) {
    __assert_fail("std::all_of(workspaces.cbegin(), workspaces.cend(), [this](const auto& ws){ return !m_pool.exists(GenTxid::Txid(ws.m_ptx->GetHash())); })"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x547,
                  "bool (anonymous namespace)::MemPoolAccept::SubmitPackage(const ATMPArgs &, std::vector<Workspace> &, PackageValidationState &, std::map<uint256, MempoolAcceptResult> &)"
                 );
  }
  local_779 = 1;
  local_69a._10_8_ =
       std::
       vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
       ::begin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                *)in_stack_fffffffffffff690);
  local_69a._2_8_ =
       std::
       vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
       ::end((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              *)in_stack_fffffffffffff690);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                      ((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                        *)in_stack_fffffffffffff698,
                       (__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                        *)in_stack_fffffffffffff690);
    source_line = (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
    ::operator*((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                 *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    bVar1 = ConsensusScriptChecks
                      (in_stack_fffffffffffff740,in_stack_fffffffffffff738,in_stack_fffffffffffff730
                      );
    if (!bVar1) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      CTransaction::GetWitnessHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      TxValidationState::TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                 (TxValidationState *)0x80128b);
      MempoolAcceptResult::Failure((TxValidationState *)in_stack_fffffffffffff6b8._M_current);
      pVar5 = std::
              map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                        ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)in_stack_fffffffffffff6a8.this,
                         (transaction_identifier<true> *)in_stack_fffffffffffff6a0,
                         (MempoolAcceptResult *)in_stack_fffffffffffff698);
      in_stack_fffffffffffff7d8 = pVar5.first._M_node;
      in_stack_fffffffffffff7d7 = pVar5.second;
      local_628 = in_stack_fffffffffffff7d8._M_node;
      local_620 = in_stack_fffffffffffff7d7;
      MempoolAcceptResult::~MempoolAcceptResult
                ((MempoolAcceptResult *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      TxValidationState::~TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688))
      ;
      local_69a[1] = (allocator<char>)0x0;
      inline_assertion_check<false,bool>
                ((bool *)in_stack_fffffffffffff6a8.this,(char *)in_stack_fffffffffffff6a0,
                 (int)((ulong)in_stack_fffffffffffff698 >> 0x20),in_stack_fffffffffffff690,
                 (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      local_779 = 0;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      in_stack_fffffffffffff7c8 = (Workspace *)&stack0xfffffffffffffe90;
      transaction_identifier<false>::ToString_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_fffffffffffff690);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffff6b8._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6b0._M_current);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,
                 (char *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 in_stack_fffffffffffff6c8);
      ValidationState<PackageValidationResult>::Invalid
                ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff6a8.this,
                 (PackageValidationResult)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                 (string *)in_stack_fffffffffffff698,(string *)in_stack_fffffffffffff690);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator(local_69a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    }
    std::unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>::operator*
              ((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
               in_stack_fffffffffffff698);
    CTxMemPool::CalculateMemPoolAncestors
              (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
               (Limits *)in_stack_fffffffffffff740,SUB81((ulong)in_stack_fffffffffffff738 >> 0x38,0)
              );
    bVar1 = util::Result::operator_cast_to_bool
                      ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    if (!bVar1) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      CTransaction::GetWitnessHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      TxValidationState::TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                 (TxValidationState *)0x8015c9);
      MempoolAcceptResult::Failure((TxValidationState *)in_stack_fffffffffffff6b8._M_current);
      pVar5 = std::
              map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                        ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)in_stack_fffffffffffff6a8.this,
                         (transaction_identifier<true> *)in_stack_fffffffffffff6a0,
                         (MempoolAcceptResult *)in_stack_fffffffffffff698);
      local_638 = (_Base_ptr)pVar5.first._M_node;
      local_630 = pVar5.second;
      MempoolAcceptResult::~MempoolAcceptResult
                ((MempoolAcceptResult *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      TxValidationState::~TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688))
      ;
      local_69e[3] = '\0';
      inline_assertion_check<false,bool>
                ((bool *)in_stack_fffffffffffff6a8.this,(char *)in_stack_fffffffffffff6a0,
                 (int)((ulong)in_stack_fffffffffffff698 >> 0x20),in_stack_fffffffffffff690,
                 (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      local_779 = 0;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      transaction_identifier<false>::ToString_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_fffffffffffff690);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffff6b8._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6b0._M_current);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,
                 (char *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 in_stack_fffffffffffff6c8);
      ValidationState<PackageValidationResult>::Invalid
                ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff6a8.this,
                 (PackageValidationResult)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                 (string *)in_stack_fffffffffffff698,(string *)in_stack_fffffffffffff690);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator((allocator<char> *)(local_69e + 2));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    }
    util::
    Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
    ::
    value_or<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>&>
              (in_stack_fffffffffffff6a0,
               (set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                *)in_stack_fffffffffffff698);
    std::
    set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
    ::operator=((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                 *)in_stack_fffffffffffff698,
                (set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                 *)in_stack_fffffffffffff690);
    std::
    set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
    ::~set((set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
            *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    util::
    Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
    ::~Result((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    bVar1 = Finalize((MemPoolAccept *)in_stack_fffffffffffff7d8._M_node,
                     (ATMPArgs *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                     in_stack_fffffffffffff7c8);
    if (!bVar1) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      CTransaction::GetWitnessHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      TxValidationState::TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                 (TxValidationState *)0x801933);
      MempoolAcceptResult::Failure((TxValidationState *)in_stack_fffffffffffff6b8._M_current);
      pVar5 = std::
              map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                        ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)in_stack_fffffffffffff6a8.this,
                         (transaction_identifier<true> *)in_stack_fffffffffffff6a0,
                         (MempoolAcceptResult *)in_stack_fffffffffffff698);
      local_648 = (_Base_ptr)pVar5.first._M_node;
      in_stack_fffffffffffff75f = pVar5.second;
      local_640 = in_stack_fffffffffffff75f;
      MempoolAcceptResult::~MempoolAcceptResult
                ((MempoolAcceptResult *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      TxValidationState::~TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688))
      ;
      local_69e[1] = '\0';
      inline_assertion_check<false,bool>
                ((bool *)in_stack_fffffffffffff6a8.this,(char *)in_stack_fffffffffffff6a0,
                 (int)((ulong)in_stack_fffffffffffff698 >> 0x20),in_stack_fffffffffffff690,
                 (char *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      local_779 = 0;
      in_stack_fffffffffffff748 = in_RCX;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      CTransaction::GetHash
                ((CTransaction *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      in_stack_fffffffffffff750 = &local_4f8;
      transaction_identifier<false>::ToString_abi_cxx11_
                ((transaction_identifier<false> *)in_stack_fffffffffffff690);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffff6b8._M_current,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff6b0._M_current);
      in_stack_fffffffffffff740 = (MemPoolAccept *)local_69e;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff6d8,
                 (char *)CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                 in_stack_fffffffffffff6c8);
      ValidationState<PackageValidationResult>::Invalid
                ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff6a8.this,
                 (PackageValidationResult)((ulong)in_stack_fffffffffffff6a0 >> 0x20),
                 (string *)in_stack_fffffffffffff698,(string *)in_stack_fffffffffffff690);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::allocator<char>::~allocator((allocator<char> *)local_69e);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    }
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
    ::operator++((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  }
  fmt.fmt = local_6e0 + 0x28;
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  ::size((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::reserve
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffff6c8,
             CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0));
  args_3 = std::
           vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
           ::cbegin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     *)in_stack_fffffffffffff690);
  args_2 = std::
           vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
           ::cend((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   *)in_stack_fffffffffffff690);
  args_1 = std::
           back_inserter<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>
                     ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       *)in_stack_fffffffffffff690);
  std::
  transform<__gnu_cxx::__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_const*,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>>,std::back_insert_iterator<std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>>,(anonymous_namespace)::MemPoolAccept::SubmitPackage((anonymous_namespace)::MemPoolAccept::ATMPArgs_const&,std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>&,PackageValidationState&,std::map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>&)::__1>
            (args_3._M_current,args_2._M_current,args_1.container);
  bVar1 = std::__cxx11::
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::empty((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  if ((!bVar1) &&
     (bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688),
                                  Trace), bVar1)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6a8.this,
               (char *)in_stack_fffffffffffff6a0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff6a8.this,
               (char *)in_stack_fffffffffffff6a0);
    in_stack_fffffffffffff690 =
         "replaced %u mempool transactions with %u new one(s) for %s additional fees, %d delta bytes\n"
    ;
    local_6e0._0_8_ =
         std::__cxx11::
         list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ::size((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    local_6e8 = (undefined1  [8])
                std::
                vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ::size((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                        *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    local_6f8._8_8_ = in_RDI[0x51] - in_RDI[0x5d];
    local_6f8._0_8_ = in_RDI[0x52] - (long)(int)in_RDI[0x5e];
    in_stack_fffffffffffff6b0._M_current = (Workspace *)local_6f8;
    in_stack_fffffffffffff6a8.this = (MemPoolAccept *)(local_6f8 + 8);
    in_stack_fffffffffffff6a0 =
         (Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
          *)local_6e8;
    in_stack_fffffffffffff698 = (Chainstate *)local_6e0;
    in_stack_fffffffffffff688 = 1;
    logging_function._M_str._0_7_ = in_stack_fffffffffffff758;
    logging_function._M_len = (size_t)in_stack_fffffffffffff750;
    logging_function._M_str._7_1_ = in_stack_fffffffffffff75f;
    source_file._M_str = (char *)in_stack_fffffffffffff748;
    source_file._M_len = (size_t)in_stack_fffffffffffff740;
    LogPrintFormatInternal<unsigned_long,unsigned_long,long,long>
              (logging_function,source_file,source_line,
               CONCAT17(in_stack_fffffffffffff6f7,
                        CONCAT16(in_stack_fffffffffffff6f6,
                                 CONCAT15(in_stack_fffffffffffff6f5,
                                          CONCAT14(in_stack_fffffffffffff6f4,
                                                   in_stack_fffffffffffff6f0)))),
               (Level)in_stack_fffffffffffff690,fmt,in_stack_fffffffffffff840,
               (unsigned_long *)args_1.container,(long *)args_2._M_current,(long *)args_3._M_current
              );
  }
  std::
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  ::begin((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
           *)in_stack_fffffffffffff690);
  std::
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  ::end((vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         *)in_stack_fffffffffffff690);
  while (bVar1 = __gnu_cxx::
                 operator==<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                           ((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                             *)in_stack_fffffffffffff698,
                            (__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                             *)in_stack_fffffffffffff690), ((bVar1 ^ 0xffU) & 1) != 0) {
    pWVar3 = __gnu_cxx::
             __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
             ::operator*((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                          *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    if ((*(byte *)(in_RSI + 0x24) & 1) == 0) {
      CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffff6a8.this,
                         (CAmount *)in_stack_fffffffffffff6a0,
                         (uint32_t)((ulong)in_stack_fffffffffffff698 >> 0x20));
    }
    if ((*(byte *)(in_RSI + 0x24) & 1) == 0) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      pWVar4 = CTransaction::GetWitnessHash
                         ((CTransaction *)
                          CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      local_538 = *(_Base_ptr *)(pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems;
      p_Stack_530 = *(_Base_ptr *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
      local_528 = *(_Base_ptr *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
      sStack_520 = *(size_t *)((pWVar4->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
      std::allocator<transaction_identifier<true>_>::allocator
                ((allocator<transaction_identifier<true>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      __l._M_array._7_1_ = in_stack_fffffffffffff6d7;
      __l._M_array._0_7_ = in_stack_fffffffffffff6d0;
      __l._M_len = (size_type)in_stack_fffffffffffff6d8;
      std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffff6c8,__l,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff6c7,in_stack_fffffffffffff6c0));
      std::allocator<transaction_identifier<true>_>::~allocator
                ((allocator<transaction_identifier<true>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    }
    else {
      std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      vector(in_stack_fffffffffffff6e0,
             (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffff6d8);
    }
    tx_00 = in_R8;
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    pWVar4 = CTransaction::GetWitnessHash
                       ((CTransaction *)
                        CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    MempoolAcceptResult::Success
              ((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff6a0,(int64_t)in_stack_fffffffffffff698,
               (CAmount)in_stack_fffffffffffff690,(CFeeRate)in_stack_fffffffffffff6b8._M_current,
               (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    pVar5 = std::
            map<uint256,MempoolAcceptResult,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::emplace<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)in_stack_fffffffffffff6a8.this,
                       (transaction_identifier<true> *)in_stack_fffffffffffff6a0,
                       (MempoolAcceptResult *)in_stack_fffffffffffff698);
    mempool_sequence = pVar5.first._M_node;
    local_650 = pVar5.second;
    local_69a._66_8_ = mempool_sequence._M_node;
    MempoolAcceptResult::~MempoolAcceptResult
              ((MempoolAcceptResult *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688))
    ;
    if (*(long *)(*in_RDI + 0x240) != 0) {
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )in_stack_fffffffffffff698);
      uVar6 = (undefined4)((ulong)in_stack_fffffffffffff690 >> 0x20);
      in_stack_fffffffffffff6d8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pWVar3->m_vsize;
      in_stack_fffffffffffff6e0 =
           (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
           pWVar3->m_ptx;
      std::unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>::operator->
                ((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      CTxMemPoolEntry::GetHeight
                ((CTxMemPoolEntry *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      bVar8 = *(byte *)(in_RSI + 0x23);
      bVar2 = IsCurrentForFeeEstimation(in_stack_fffffffffffff698);
      uVar7 = (undefined4)((ulong)in_stack_fffffffffffff698 >> 0x20);
      in_stack_fffffffffffff6d7 =
           CTxMemPool::HasNoInputsOf
                     ((CTxMemPool *)in_stack_fffffffffffff6b0._M_current,
                      (CTransaction *)in_stack_fffffffffffff6a8.this);
      in_stack_fffffffffffff698 =
           (Chainstate *)CONCAT44(uVar7,(uint)(byte)in_stack_fffffffffffff6d7);
      in_stack_fffffffffffff690 = (char *)(CONCAT44(uVar6,(uint)bVar2) & 0xffffffff00000001);
      in_stack_fffffffffffff688 = bVar8 & 1;
      NewMempoolTransactionInfo::NewMempoolTransactionInfo
                ((NewMempoolTransactionInfo *)in_stack_fffffffffffff6b0._M_current,
                 (CTransactionRef *)in_stack_fffffffffffff6a8.this,
                 (CAmount *)in_stack_fffffffffffff6a0,(int64_t)in_stack_fffffffffffff698,
                 (uint)((ulong)in_stack_fffffffffffff690 >> 0x20),false,false,false,
                 SUB81(in_stack_fffffffffffff690,0));
      in_stack_fffffffffffff6c8 = *(allocator<char> **)(*in_RDI + 0x240);
      CTxMemPool::GetAndIncrementSequence
                ((CTxMemPool *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
      ValidationSignals::TransactionAddedToMempool
                ((ValidationSignals *)pWVar4,tx_00,(uint64_t)mempool_sequence._M_node);
      NewMempoolTransactionInfo::~NewMempoolTransactionInfo
                ((NewMempoolTransactionInfo *)
                 CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
    }
    std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
    ~vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *)
            in_stack_fffffffffffff698);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
    ::operator++((__normal_iterator<(anonymous_namespace)::MemPoolAccept::Workspace_*,_std::vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>_>
                  *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  }
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::~vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffff698);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_779 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool MemPoolAccept::SubmitPackage(const ATMPArgs& args, std::vector<Workspace>& workspaces,
                                  PackageValidationState& package_state,
                                  std::map<uint256, MempoolAcceptResult>& results)
{
    AssertLockHeld(cs_main);
    AssertLockHeld(m_pool.cs);
    // Sanity check: none of the transactions should be in the mempool, and none of the transactions
    // should have a same-txid-different-witness equivalent in the mempool.
    assert(std::all_of(workspaces.cbegin(), workspaces.cend(), [this](const auto& ws){
        return !m_pool.exists(GenTxid::Txid(ws.m_ptx->GetHash())); }));

    bool all_submitted = true;
    // ConsensusScriptChecks adds to the script cache and is therefore consensus-critical;
    // CheckInputsFromMempoolAndCache asserts that transactions only spend coins available from the
    // mempool or UTXO set. Submit each transaction to the mempool immediately after calling
    // ConsensusScriptChecks to make the outputs available for subsequent transactions.
    for (Workspace& ws : workspaces) {
        if (!ConsensusScriptChecks(args, ws)) {
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            // Since PolicyScriptChecks() passed, this should never fail.
            Assume(false);
            all_submitted = false;
            package_state.Invalid(PackageValidationResult::PCKG_MEMPOOL_ERROR,
                                  strprintf("BUG! PolicyScriptChecks succeeded but ConsensusScriptChecks failed: %s",
                                            ws.m_ptx->GetHash().ToString()));
        }

        // Re-calculate mempool ancestors to call addUnchecked(). They may have changed since the
        // last calculation done in PreChecks, since package ancestors have already been submitted.
        {
            auto ancestors{m_pool.CalculateMemPoolAncestors(*ws.m_entry, m_pool.m_opts.limits)};
            if(!ancestors) {
                results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
                // Since PreChecks() and PackageMempoolChecks() both enforce limits, this should never fail.
                Assume(false);
                all_submitted = false;
                package_state.Invalid(PackageValidationResult::PCKG_MEMPOOL_ERROR,
                                    strprintf("BUG! Mempool ancestors or descendants were underestimated: %s",
                                                ws.m_ptx->GetHash().ToString()));
            }
            ws.m_ancestors = std::move(ancestors).value_or(ws.m_ancestors);
        }
        // If we call LimitMempoolSize() for each individual Finalize(), the mempool will not take
        // the transaction's descendant feerate into account because it hasn't seen them yet. Also,
        // we risk evicting a transaction that a subsequent package transaction depends on. Instead,
        // allow the mempool to temporarily bypass limits, the maximum package size) while
        // submitting transactions individually and then trim at the very end.
        if (!Finalize(args, ws)) {
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            // Since LimitMempoolSize() won't be called, this should never fail.
            Assume(false);
            all_submitted = false;
            package_state.Invalid(PackageValidationResult::PCKG_MEMPOOL_ERROR,
                                  strprintf("BUG! Adding to mempool failed: %s", ws.m_ptx->GetHash().ToString()));
        }
    }

    std::vector<Wtxid> all_package_wtxids;
    all_package_wtxids.reserve(workspaces.size());
    std::transform(workspaces.cbegin(), workspaces.cend(), std::back_inserter(all_package_wtxids),
                   [](const auto& ws) { return ws.m_ptx->GetWitnessHash(); });

    if (!m_subpackage.m_replaced_transactions.empty()) {
        LogDebug(BCLog::MEMPOOL, "replaced %u mempool transactions with %u new one(s) for %s additional fees, %d delta bytes\n",
                 m_subpackage.m_replaced_transactions.size(), workspaces.size(),
                 m_subpackage.m_total_modified_fees - m_subpackage.m_conflicting_fees,
                 m_subpackage.m_total_vsize - static_cast<int>(m_subpackage.m_conflicting_size));
    }

    // Add successful results. The returned results may change later if LimitMempoolSize() evicts them.
    for (Workspace& ws : workspaces) {
        const auto effective_feerate = args.m_package_feerates ? ws.m_package_feerate :
            CFeeRate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
        const auto effective_feerate_wtxids = args.m_package_feerates ? all_package_wtxids :
            std::vector<Wtxid>{ws.m_ptx->GetWitnessHash()};
        results.emplace(ws.m_ptx->GetWitnessHash(),
                        MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions), ws.m_vsize,
                                         ws.m_base_fees, effective_feerate, effective_feerate_wtxids));
        if (!m_pool.m_opts.signals) continue;
        const CTransaction& tx = *ws.m_ptx;
        const auto tx_info = NewMempoolTransactionInfo(ws.m_ptx, ws.m_base_fees,
                                                       ws.m_vsize, ws.m_entry->GetHeight(),
                                                       args.m_bypass_limits, args.m_package_submission,
                                                       IsCurrentForFeeEstimation(m_active_chainstate),
                                                       m_pool.HasNoInputsOf(tx));
        m_pool.m_opts.signals->TransactionAddedToMempool(tx_info, m_pool.GetAndIncrementSequence());
    }
    return all_submitted;
}